

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adynarray.c
# Opt level: O3

bool private_ACUtils_ADynArray_reserve
               (void *dynArray,size_t reserveSize,bool forceExactSize,size_t typeSize)

{
  ulong uVar1;
  code *pcVar2;
  size_t sVar3;
  long lVar4;
  
  if (dynArray == (void *)0x0) {
    return false;
  }
  if ((reserveSize <= *(ulong *)((long)dynArray + 0x20)) && (*(long *)((long)dynArray + 0x28) != 0))
  {
    return true;
  }
  pcVar2 = *(code **)((long)dynArray + 0x10);
  sVar3 = reserveSize;
  if (pcVar2 != (code *)0x0) {
    if (forceExactSize != false) {
      uVar1 = (*pcVar2)(0,typeSize);
      if (uVar1 <= reserveSize) goto LAB_00151ca7;
      pcVar2 = *(code **)((long)dynArray + 0x10);
    }
    sVar3 = (*pcVar2)(reserveSize,typeSize);
    if (sVar3 < reserveSize) {
      return false;
    }
  }
LAB_00151ca7:
  lVar4 = (**dynArray)(*(undefined8 *)((long)dynArray + 0x28),typeSize * sVar3);
  if (lVar4 != 0) {
    *(size_t *)((long)dynArray + 0x20) = sVar3;
    *(long *)((long)dynArray + 0x28) = lVar4;
  }
  return (uint)(lVar4 != 0);
}

Assistant:

ACUTILS_HD_FUNC bool private_ACUtils_ADynArray_reserve(void *dynArray, size_t reserveSize, bool forceExactSize, size_t typeSize)
{
    if(dynArray != NULL) {
        struct private_ACUtils_DynArray_Prototype* prototype = (struct private_ACUtils_DynArray_Prototype*) dynArray;
        if(prototype->capacity < reserveSize || prototype->buffer == NULL) {
            size_t aimedCapacity = reserveSize;
            if(prototype->growStrategy != NULL && (!forceExactSize || reserveSize < prototype->growStrategy(0, typeSize)))
                aimedCapacity = prototype->growStrategy(reserveSize, typeSize);
            if(aimedCapacity >= reserveSize) {
                char* tmpBuffer = (char*) prototype->reallocator(prototype->buffer, aimedCapacity * typeSize);
                if(tmpBuffer != NULL) {
                    prototype->capacity = aimedCapacity;
                    prototype->buffer = tmpBuffer;
                    return true;
                }
            }
        } else {
            return true;
        }
    }
    return false;
}